

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objinfo.cpp
# Opt level: O3

bool findSymbolForName(symbol_section_accessor syms,Elf64_Addr *value,Elf_Half *section_index,
                      string *name)

{
  int iVar1;
  Elf_Xword EVar2;
  Elf_Xword index;
  bool bVar3;
  uchar other;
  uchar type;
  uchar bind;
  string candidateName;
  Elf_Xword size;
  
  candidateName._M_dataplus._M_p = (pointer)&candidateName.field_2;
  candidateName._M_string_length = 0;
  candidateName.field_2._M_local_buf[0] = '\0';
  EVar2 = ELFIO::symbol_section_accessor::get_symbols_num(&syms);
  if (EVar2 == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    index = 0;
    do {
      ELFIO::symbol_section_accessor::get_symbol
                (&syms,index,&candidateName,value,&size,&bind,&type,section_index,&other);
      if ((candidateName._M_string_length == name->_M_string_length) &&
         ((candidateName._M_string_length == 0 ||
          (iVar1 = bcmp(candidateName._M_dataplus._M_p,(name->_M_dataplus)._M_p,
                        candidateName._M_string_length), iVar1 == 0)))) break;
      index = index + 1;
      bVar3 = index < EVar2;
    } while (index != EVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)candidateName._M_dataplus._M_p != &candidateName.field_2) {
    operator_delete(candidateName._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool findSymbolForName(ELFIO::symbol_section_accessor syms, ELFIO::Elf64_Addr &value, ELFIO::Elf_Half &section_index, std::string &name)
{
	ELFIO::Elf_Xword size;
	unsigned char bind;
	unsigned char type;
	unsigned char other;
	std::string candidateName;

	ELFIO::Elf_Xword numSymbols = syms.get_symbols_num();
	for(ELFIO::Elf_Xword i = 0; i < numSymbols; i++) {
		syms.get_symbol(i, candidateName, value, size, bind, type, section_index, other);
		if(candidateName == name) {
			return true;
		}
	}

	return false;
}